

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

int __thiscall
Catch::Detail::anon_unknown_0::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this,int c
          )

{
  long lVar1;
  long lVar2;
  int in_ESI;
  long *in_RDI;
  string *in_stack_ffffffffffffff88;
  OutputDebugWriter *this_00;
  allocator local_31;
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  (**(code **)(*in_RDI + 0x30))();
  if (local_c != -1) {
    lVar1 = std::streambuf::pbase();
    lVar2 = std::streambuf::epptr();
    if (lVar1 == lVar2) {
      this_00 = (OutputDebugWriter *)(in_RDI + 0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,1,(char)local_c,&local_31);
      OutputDebugWriter::operator()(this_00,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
    else {
      std::streambuf::sputc((char)in_RDI);
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) override {
                sync();

                if( c != EOF ) {
                    if( pbase() == epptr() )
                        m_writer( std::string( 1, static_cast<char>( c ) ) );
                    else
                        sputc( static_cast<char>( c ) );
                }
                return 0;
            }